

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::clear
          (Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  iterator pos;
  Node *local_58;
  InnerMap *pIStack_50;
  size_type local_48;
  iterator local_40;
  iterator local_28;
  
  begin(&local_28,this);
  local_48 = local_28.it_.bucket_index_;
  pIStack_50 = local_28.it_.m_;
  local_58 = local_28.it_.node_;
  while (local_58 != (Node *)0x0) {
    pos.it_.m_ = pIStack_50;
    pos.it_.node_ = local_58;
    pos.it_.bucket_index_ = local_48;
    erase(&local_40,this,pos);
    local_48 = local_40.it_.bucket_index_;
    pIStack_50 = local_40.it_.m_;
    local_58 = local_40.it_.node_;
  }
  return;
}

Assistant:

void clear() { erase(begin(), end()); }